

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

void __thiscall
duckdb::LocalStorage::DropColumn
          (LocalStorage *this,DataTable *old_dt,DataTable *new_dt,idx_t drop_column_index)

{
  type __args_1;
  shared_ptr<duckdb::LocalTableStorage,_true> new_storage;
  shared_ptr<duckdb::LocalTableStorage,_true> storage;
  undefined1 local_69;
  shared_ptr<duckdb::LocalTableStorage,_true> local_68;
  undefined1 local_50 [40];
  shared_ptr<duckdb::LocalTableStorage> local_28;
  
  local_50._16_8_ = drop_column_index;
  LocalTableManager::MoveEntry((LocalTableManager *)local_50,(DataTable *)&this->table_manager);
  if (local_50._0_8_ != 0) {
    __args_1 = shared_ptr<duckdb::LocalTableStorage,_true>::operator*
                         ((shared_ptr<duckdb::LocalTableStorage,_true> *)local_50);
    local_28.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::LocalTableStorage,std::allocator<duckdb::LocalTableStorage>,duckdb::DataTable&,duckdb::LocalTableStorage&,unsigned_long_const&>
              (&local_28.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(LocalTableStorage **)&local_28,
               (allocator<duckdb::LocalTableStorage> *)&local_69,new_dt,__args_1,
               (unsigned_long *)(local_50 + 0x10));
    shared_ptr<duckdb::LocalTableStorage,_true>::shared_ptr(&local_68,&local_28);
    if (local_28.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_50._24_8_ =
         local_68.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_50._32_8_ =
         local_68.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_68.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_68.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LocalTableManager::InsertEntry
              (&this->table_manager,new_dt,
               (shared_ptr<duckdb::LocalTableStorage,_true> *)(local_50 + 0x18));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._32_8_);
    }
    if (local_68.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.internal.
                 super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  return;
}

Assistant:

void LocalStorage::DropColumn(DataTable &old_dt, DataTable &new_dt, const idx_t drop_column_index) {
	// check if there are any pending appends for the old version of the table
	auto storage = table_manager.MoveEntry(old_dt);
	if (!storage) {
		return;
	}
	auto new_storage = make_shared_ptr<LocalTableStorage>(new_dt, *storage, drop_column_index);
	table_manager.InsertEntry(new_dt, std::move(new_storage));
}